

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManResubPerform_rec(Gia_ResbMan_t *p,int nLimit)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  word *pIn2;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int iDiv1_4;
  int iDiv0_4;
  int iNode_5;
  int fComp_5;
  int iDiv_1;
  int fUseOr_1;
  int iNode_4;
  word *pDiv;
  int fComp_4;
  int iDiv;
  int fUseOr;
  int iDiv11_1;
  int iDiv10_1;
  int fComp1_1;
  int Div1_1;
  int iDiv01;
  int iDiv00;
  int fComp0;
  int Div0;
  int iDiv1_3;
  int iDiv0_3;
  int fComp_3;
  int iNode_3;
  int iDiv11;
  int iDiv10;
  int fComp1;
  int Div1;
  int iDiv1_2;
  int iDiv0_2;
  int fComp_2;
  int iNode_2;
  int iDiv1_1;
  int iDiv0_1;
  int fComp_1;
  int iNode_1;
  int iDiv1;
  int iDiv0;
  int fComp;
  int iNode;
  int nMints [2];
  int nVars;
  int iResLit;
  int Max2;
  int Max1;
  int TopTwoW [2];
  int TopOneW [2];
  int nLimit_local;
  Gia_ResbMan_t *p_local;
  
  memset(TopTwoW,0,8);
  memset(&Max2,0,8);
  iVar2 = Vec_PtrSize(p->vDivs);
  if (p->fVerbose != 0) {
    uVar3 = Abc_TtCountOnesVec(p->pSets[0],p->nWords);
    uVar4 = Abc_TtCountOnesVec(p->pSets[1],p->nWords);
    printf("      ");
    printf("ISF: ");
    printf("0=%5d (%5.2f %%) ",((double)(int)uVar3 * 100.0) / (double)(p->nWords << 6),(ulong)uVar3)
    ;
    printf("1=%5d (%5.2f %%)  ",((double)(int)uVar4 * 100.0) / (double)(p->nWords << 6),(ulong)uVar4
          );
  }
  iVar5 = Abc_TtIsConst0(p->pSets[1],p->nWords);
  if (iVar5 == 0) {
    iVar5 = Abc_TtIsConst0(p->pSets[0],p->nWords);
    if (iVar5 == 0) {
      p_local._4_4_ =
           Gia_ManFindOneUnate(p->pSets,p->vDivs,p->nWords,p->vUnateLits,p->vNotUnateVars,
                               p->fVerbose);
      if (p_local._4_4_ < 0) {
        if (nLimit == 0) {
          p_local._4_4_ = -1;
        }
        else {
          Gia_ManSortUnates(p->pSets,p->vDivs,p->nWords,p->vUnateLits,p->vUnateLitsW,p->vSorter);
          iVar5 = Gia_ManFindTwoUnate(p->pSets,p->vDivs,p->nWords,p->vUnateLits,p->vUnateLitsW,
                                      p->fVerbose);
          if (iVar5 < 0) {
            Vec_IntTwoFindCommon(p->vNotUnateVars[0],p->vNotUnateVars[1],p->vBinateVars);
            iVar5 = Vec_IntSize(p->vBinateVars);
            if (p->nDivsMax < iVar5) {
              Vec_IntShrink(p->vBinateVars,p->nDivsMax);
            }
            if (p->fVerbose != 0) {
              uVar3 = Vec_IntSize(p->vBinateVars);
              printf("  B = %3d",(ulong)uVar3);
            }
            if ((p->fUseXor == 0) ||
               (iVar5 = Gia_ManFindXor(p->pSets,p->vDivs,p->nWords,p->vBinateVars,p->vUnatePairs,
                                       p->fVerbose), iVar5 < 0)) {
              if (nLimit == 1) {
                p_local._4_4_ = -1;
              }
              else {
                Gia_ManFindUnatePairs
                          (p->pSets,p->vDivs,p->nWords,p->vBinateVars,p->vUnatePairs,p->fVerbose);
                Gia_ManSortPairs(p->pSets,p->vDivs,p->nWords,p->vUnatePairs,p->vUnatePairsW,
                                 p->vSorter);
                iVar5 = Gia_ManFindDivGate(p->pSets,p->vDivs,p->nWords,p->vUnateLits,p->vUnatePairs,
                                           p->vUnateLitsW,p->vUnatePairsW,p->pDivA);
                if (iVar5 < 0) {
                  if (nLimit == 2) {
                    p_local._4_4_ = -1;
                  }
                  else {
                    iVar5 = Gia_ManFindGateGate(p->pSets,p->vDivs,p->nWords,p->vUnatePairs,
                                                p->vUnatePairsW,p->pDivA,p->pDivB);
                    if (iVar5 < 0) {
                      if (nLimit == 3) {
                        p_local._4_4_ = -1;
                      }
                      else {
                        iVar5 = Vec_IntSize(p->vUnateLits[0]);
                        iVar6 = Vec_IntSize(p->vUnateLits[1]);
                        iVar7 = Vec_IntSize(p->vUnatePairs[0]);
                        iVar8 = Vec_IntSize(p->vUnatePairs[1]);
                        if (iVar5 + iVar6 + iVar7 + iVar8 == 0) {
                          p_local._4_4_ = -1;
                        }
                        else {
                          iVar5 = Vec_IntSize(p->vUnateLitsW[0]);
                          if (iVar5 == 0) {
                            local_14c = 0;
                          }
                          else {
                            local_14c = Vec_IntEntry(p->vUnateLitsW[0],0);
                          }
                          TopTwoW[0] = local_14c;
                          iVar5 = Vec_IntSize(p->vUnateLitsW[1]);
                          if (iVar5 == 0) {
                            local_150 = 0;
                          }
                          else {
                            local_150 = Vec_IntEntry(p->vUnateLitsW[1],0);
                          }
                          TopTwoW[1] = local_150;
                          iVar5 = Vec_IntSize(p->vUnatePairsW[0]);
                          if (iVar5 == 0) {
                            local_154 = 0;
                          }
                          else {
                            local_154 = Vec_IntEntry(p->vUnatePairsW[0],0);
                          }
                          Max2 = local_154;
                          iVar5 = Vec_IntSize(p->vUnatePairsW[1]);
                          if (iVar5 == 0) {
                            local_158 = 0;
                          }
                          else {
                            local_158 = Vec_IntEntry(p->vUnatePairsW[1],0);
                          }
                          Max1 = local_158;
                          iVar5 = Abc_MaxInt(TopTwoW[0],TopTwoW[1]);
                          iVar6 = Abc_MaxInt(Max2,Max1);
                          iVar7 = Abc_MaxInt(iVar5,iVar6);
                          if (iVar7 == 0) {
                            p_local._4_4_ = -1;
                          }
                          else {
                            if (iVar6 / 2 < iVar5) {
                              if ((iVar5 == TopTwoW[0]) || (iVar5 == TopTwoW[1])) {
                                uVar3 = (uint)(iVar5 == TopTwoW[0]);
                                iVar5 = Vec_IntEntry(p->vUnateLits
                                                     [(int)(uint)((uVar3 != 0 ^ 0xffU) & 1)],0);
                                iVar7 = Abc_LitIsCompl(iVar5);
                                p_00 = p->vDivs;
                                iVar8 = Abc_Lit2Var(iVar5);
                                pIn2 = (word *)Vec_PtrEntry(p_00,iVar8);
                                Abc_TtAndSharp(p->pSets[(int)uVar3],p->pSets[(int)uVar3],pIn2,
                                               p->nWords,(uint)((iVar7 != 0 ^ 0xffU) & 1));
                                if (p->fVerbose != 0) {
                                  printf("\n");
                                }
                                iVar7 = Gia_ManResubPerform_rec(p,nLimit + -1);
                                if (-1 < iVar7) {
                                  iVar6 = Vec_IntSize(p->vGates);
                                  pVVar1 = p->vGates;
                                  iVar5 = Abc_LitNot(iVar5);
                                  iVar7 = Abc_LitNotCond(iVar7,uVar3);
                                  Vec_IntPushTwo(pVVar1,iVar5,iVar7);
                                  iVar2 = Abc_Var2Lit(iVar2 + iVar6 / 2,uVar3);
                                  return iVar2;
                                }
                              }
                              if (iVar6 == 0) {
                                return -1;
                              }
                            }
                            else {
                              if ((iVar6 == Max2) || (iVar6 == Max1)) {
                                uVar3 = (uint)(iVar6 == Max2);
                                iVar6 = Vec_IntEntry(p->vUnatePairs
                                                     [(int)(uint)((uVar3 != 0 ^ 0xffU) & 1)],0);
                                iVar7 = Abc_LitIsCompl(iVar6);
                                Gia_ManDeriveDivPair(iVar6,p->vDivs,p->nWords,p->pDivA);
                                Abc_TtAndSharp(p->pSets[(int)uVar3],p->pSets[(int)uVar3],p->pDivA,
                                               p->nWords,(uint)((iVar7 != 0 ^ 0xffU) & 1));
                                if (p->fVerbose != 0) {
                                  printf("\n");
                                }
                                iVar8 = Gia_ManResubPerform_rec(p,nLimit + -2);
                                if (-1 < iVar8) {
                                  iVar5 = Vec_IntSize(p->vGates);
                                  iVar2 = iVar2 + iVar5 / 2;
                                  uVar4 = Abc_Lit2Var(iVar6);
                                  iVar5 = Abc_Lit2Var(iVar6);
                                  Vec_IntPushTwo(p->vGates,uVar4 & 0x7fff,iVar5 >> 0xf);
                                  pVVar1 = p->vGates;
                                  iVar5 = Abc_LitNotCond(iVar8,uVar3);
                                  iVar6 = Abc_Var2Lit(iVar2,(uint)((iVar7 != 0 ^ 0xffU) & 1));
                                  Vec_IntPushTwo(pVVar1,iVar5,iVar6);
                                  iVar2 = Abc_Var2Lit(iVar2 + 1,uVar3);
                                  return iVar2;
                                }
                              }
                              if (iVar5 == 0) {
                                return -1;
                              }
                            }
                            p_local._4_4_ = -1;
                          }
                        }
                      }
                    }
                    else {
                      iVar6 = Vec_IntSize(p->vGates);
                      iVar2 = iVar2 + iVar6 / 2;
                      iVar6 = Abc_LitIsCompl(iVar5);
                      uVar3 = Abc_Lit2Var(iVar5);
                      iVar5 = Abc_Lit2Var(iVar5);
                      pVVar1 = p->vUnatePairs[(int)(uint)((iVar6 != 0 ^ 0xffU) & 1)];
                      iVar7 = Abc_Lit2Var(uVar3 & 0x7fff);
                      iVar7 = Vec_IntEntry(pVVar1,iVar7);
                      uVar4 = Abc_LitIsCompl(iVar7);
                      uVar3 = Abc_LitIsCompl(uVar3 & 0x7fff);
                      uVar9 = Abc_Lit2Var(iVar7);
                      iVar7 = Abc_Lit2Var(iVar7);
                      pVVar1 = p->vUnatePairs[(int)(uint)((iVar6 != 0 ^ 0xffU) & 1)];
                      iVar8 = Abc_Lit2Var(iVar5 >> 0xf);
                      iVar8 = Vec_IntEntry(pVVar1,iVar8);
                      uVar10 = Abc_LitIsCompl(iVar8);
                      uVar11 = Abc_LitIsCompl(iVar5 >> 0xf);
                      uVar12 = Abc_Lit2Var(iVar8);
                      iVar5 = Abc_Lit2Var(iVar8);
                      Vec_IntPushTwo(p->vGates,uVar9 & 0x7fff,iVar7 >> 0xf);
                      Vec_IntPushTwo(p->vGates,uVar12 & 0x7fff,iVar5 >> 0xf);
                      pVVar1 = p->vGates;
                      iVar5 = Abc_Var2Lit(iVar2,uVar4 ^ uVar3);
                      iVar7 = Abc_Var2Lit(iVar2 + 1,uVar10 ^ uVar11);
                      Vec_IntPushTwo(pVVar1,iVar5,iVar7);
                      p_local._4_4_ = Abc_Var2Lit(iVar2 + 2,iVar6);
                    }
                  }
                }
                else {
                  iVar6 = Vec_IntSize(p->vGates);
                  iVar2 = iVar2 + iVar6 / 2;
                  iVar6 = Abc_LitIsCompl(iVar5);
                  uVar3 = Abc_Lit2Var(iVar5);
                  iVar5 = Abc_Lit2Var(iVar5);
                  pVVar1 = p->vUnatePairs[(int)(uint)((iVar6 != 0 ^ 0xffU) & 1)];
                  iVar7 = Abc_Lit2Var(iVar5 >> 0xf);
                  iVar7 = Vec_IntEntry(pVVar1,iVar7);
                  uVar4 = Abc_LitIsCompl(iVar7);
                  uVar9 = Abc_LitIsCompl(iVar5 >> 0xf);
                  uVar10 = Abc_Lit2Var(iVar7);
                  iVar5 = Abc_Lit2Var(iVar7);
                  Vec_IntPushTwo(p->vGates,uVar10 & 0x7fff,iVar5 >> 0xf);
                  pVVar1 = p->vGates;
                  iVar5 = Abc_Var2Lit(iVar2,uVar4 ^ uVar9);
                  Vec_IntPushTwo(pVVar1,uVar3 & 0x7fff,iVar5);
                  p_local._4_4_ = Abc_Var2Lit(iVar2 + 1,iVar6);
                }
              }
            }
            else {
              iVar6 = Vec_IntSize(p->vGates);
              iVar7 = Abc_LitIsCompl(iVar5);
              uVar3 = Abc_Lit2Var(iVar5);
              uVar3 = uVar3 & 0x7fff;
              iVar5 = Abc_Lit2Var(iVar5);
              iVar5 = iVar5 >> 0xf;
              iVar8 = Abc_LitIsCompl(uVar3);
              if (iVar8 != 0) {
                __assert_fail("!Abc_LitIsCompl(iDiv0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x468,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              iVar8 = Abc_LitIsCompl(iVar5);
              if (iVar8 != 0) {
                __assert_fail("!Abc_LitIsCompl(iDiv1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x469,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              if ((int)uVar3 <= iVar5) {
                __assert_fail("iDiv0 > iDiv1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x46a,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              Vec_IntPushTwo(p->vGates,uVar3,iVar5);
              p_local._4_4_ = Abc_Var2Lit(iVar2 + iVar6 / 2,iVar7);
            }
          }
          else {
            iVar6 = Vec_IntSize(p->vGates);
            iVar7 = Abc_LitIsCompl(iVar5);
            uVar3 = Abc_Lit2Var(iVar5);
            iVar5 = Abc_Lit2Var(iVar5);
            if (iVar5 >> 0xf <= (int)(uVar3 & 0x7fff)) {
              __assert_fail("iDiv0 < iDiv1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                            ,0x456,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
            }
            Vec_IntPushTwo(p->vGates,uVar3 & 0x7fff,iVar5 >> 0xf);
            p_local._4_4_ = Abc_Var2Lit(iVar2 + iVar6 / 2,iVar7);
          }
        }
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManResubPerform_rec( Gia_ResbMan_t * p, int nLimit )
{
    int TopOneW[2] = {0}, TopTwoW[2] = {0}, Max1, Max2, iResLit, nVars = Vec_PtrSize(p->vDivs);
    if ( p->fVerbose )
    {
        int nMints[2] = { Abc_TtCountOnesVec(p->pSets[0], p->nWords), Abc_TtCountOnesVec(p->pSets[1], p->nWords) };
        printf( "      " ); 
        printf( "ISF: " ); 
        printf( "0=%5d (%5.2f %%) ",  nMints[0], 100.0*nMints[0]/(64*p->nWords) );
        printf( "1=%5d (%5.2f %%)  ", nMints[1], 100.0*nMints[1]/(64*p->nWords) );
    }
    if ( Abc_TtIsConst0( p->pSets[1], p->nWords ) )
        return 0;
    if ( Abc_TtIsConst0( p->pSets[0], p->nWords ) )
        return 1;
    iResLit = Gia_ManFindOneUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vNotUnateVars, p->fVerbose );
    if ( iResLit >= 0 ) // buffer
        return iResLit;
    if ( nLimit == 0 )
        return -1;
    Gia_ManSortUnates( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->vSorter );
    iResLit = Gia_ManFindTwoUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->fVerbose );
    if ( iResLit >= 0 ) // and
    {
        int iNode = nVars + Vec_IntSize(p->vGates)/2;
        int fComp = Abc_LitIsCompl(iResLit);
        int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
        int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
        assert( iDiv0 < iDiv1 );
        Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
        return Abc_Var2Lit( iNode, fComp );
    }
    Vec_IntTwoFindCommon( p->vNotUnateVars[0], p->vNotUnateVars[1], p->vBinateVars );
    if ( Vec_IntSize(p->vBinateVars) > p->nDivsMax )
        Vec_IntShrink( p->vBinateVars, p->nDivsMax );
    if ( p->fVerbose ) printf( "  B = %3d", Vec_IntSize(p->vBinateVars) );
    //Gia_ManSortBinate( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vSorter );
    if ( p->fUseXor )
    {
        iResLit = Gia_ManFindXor( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
        if ( iResLit >= 0 ) // xor
        {
            int iNode = nVars + Vec_IntSize(p->vGates)/2;
            int fComp = Abc_LitIsCompl(iResLit);
            int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
            int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
            assert( !Abc_LitIsCompl(iDiv0) );
            assert( !Abc_LitIsCompl(iDiv1) );
            assert( iDiv0 > iDiv1 );
            Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
            return Abc_Var2Lit( iNode, fComp );
        }
    }
    if ( nLimit == 1 )
        return -1;
    Gia_ManFindUnatePairs( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
    Gia_ManSortPairs( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->vSorter );
    iResLit = Gia_ManFindDivGate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnatePairs, p->vUnateLitsW, p->vUnatePairsW, p->pDivA );
    if ( iResLit >= 0 ) // and(div,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // div
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   

        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, iDiv0, Abc_Var2Lit(iNode, fComp1) );
        return Abc_Var2Lit( iNode+1, fComp );
    }
    if ( nLimit == 2 )
        return -1;
    iResLit = Gia_ManFindGateGate( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->pDivA, p->pDivB );
    if ( iResLit >= 0 ) // and(pair,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // pair
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div0   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv0) );
        int fComp0 = Abc_LitIsCompl(Div0) ^ Abc_LitIsCompl(iDiv0);
        int iDiv00 = Abc_Lit2Var(Div0) & 0x7FFF;
        int iDiv01 = Abc_Lit2Var(Div0) >> 15;   
        
        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   
        
        Vec_IntPushTwo( p->vGates, iDiv00, iDiv01 );
        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, Abc_Var2Lit(iNode, fComp0), Abc_Var2Lit(iNode+1, fComp1) );
        return Abc_Var2Lit( iNode+2, fComp );
    }
    if ( nLimit == 3 )
        return -1;
    if ( Vec_IntSize(p->vUnateLits[0]) + Vec_IntSize(p->vUnateLits[1]) + Vec_IntSize(p->vUnatePairs[0]) + Vec_IntSize(p->vUnatePairs[1]) == 0 )
        return -1;

    TopOneW[0] = Vec_IntSize(p->vUnateLitsW[0]) ? Vec_IntEntry(p->vUnateLitsW[0], 0) : 0;
    TopOneW[1] = Vec_IntSize(p->vUnateLitsW[1]) ? Vec_IntEntry(p->vUnateLitsW[1], 0) : 0;

    TopTwoW[0] = Vec_IntSize(p->vUnatePairsW[0]) ? Vec_IntEntry(p->vUnatePairsW[0], 0) : 0;
    TopTwoW[1] = Vec_IntSize(p->vUnatePairsW[1]) ? Vec_IntEntry(p->vUnatePairsW[1], 0) : 0;

    Max1 = Abc_MaxInt(TopOneW[0], TopOneW[1]);
    Max2 = Abc_MaxInt(TopTwoW[0], TopTwoW[1]);
    if ( Abc_MaxInt(Max1, Max2) == 0 )
        return -1;
    if ( Max1 > Max2/2 )
    {
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
        if ( Max2 == 0 )
            return -1;
/*
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
*/
    }
    else
    {
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
        if ( Max1 == 0 )
            return -1;
/*
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
*/
    }
    return -1;
}